

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::reset(FederateState *this,CoreFederateInfo *fedInfo)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  _Elt_pointer in_RSI;
  FederateState *in_RDI;
  pair<int,_bool> *prop_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__range1_2;
  pair<int,_int> *prop_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  FederateState *in_stack_000000f8;
  Time in_stack_00000100;
  undefined7 in_stack_ffffffffffffff08;
  FederateStates in_stack_ffffffffffffff0f;
  shared_ptr<helics::FederateOperator> *in_stack_ffffffffffffff10;
  __atomic_base<unsigned_short> *in_stack_ffffffffffffff18;
  LogManager *this_01;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_ffffffffffffff30;
  undefined1 local_c0 [8];
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  const_iterator local_90;
  pointer local_88;
  InterfaceInfo *in_stack_ffffffffffffff80;
  const_iterator local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  reference local_58;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *local_50;
  __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
  local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_10;
  
  local_10 = in_RSI;
  std::atomic<helics::FederateStates>::operator=
            ((atomic<helics::FederateStates> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::clear
            (in_stack_ffffffffffffff30);
  std::
  map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::clear((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
           *)0x4e2f81);
  InterfaceInfo::reset(in_stack_ffffffffffffff80);
  std::
  make_unique<helics::TimeCoordinator,helics::FederateState::reset(helics::CoreFederateInfo_const&)::__1>
            ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff58);
  std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::operator=
            ((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
             in_stack_ffffffffffffff10,
             (unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
  ~unique_ptr((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
              in_stack_ffffffffffffff10);
  in_RDI->only_transmit_on_change = false;
  in_RDI->realtime = false;
  in_RDI->observer = false;
  in_RDI->mSourceOnly = false;
  in_RDI->mCallbackBased = false;
  in_RDI->strict_input_type_checking = false;
  in_RDI->ignore_unit_mismatch = false;
  in_RDI->mSlowResponding = false;
  std::make_unique<helics::LogManager>();
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator=
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
             in_stack_ffffffffffffff10,
             (unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::~unique_ptr
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
             in_stack_ffffffffffffff10);
  in_RDI->maxLogLevel = -4;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  in_RDI->wait_for_current_time = false;
  in_RDI->ignore_time_mismatch_warnings = false;
  in_RDI->mProfilerActive = false;
  in_RDI->mLocalProfileCapture = false;
  in_RDI->errorCode = 0;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e3080);
  (in_RDI->rt_lag).internalTimeCode = 0;
  (in_RDI->rt_lead).internalTimeCode = 0;
  (in_RDI->grantTimeOutPeriod).internalTimeCode = 0;
  in_RDI->realTimeTimerIndex = -1;
  in_RDI->grantTimeoutTimeIndex = -1;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
  in_RDI->iterating = false;
  in_RDI->timeGranted_mode = false;
  in_RDI->terminate_on_error = false;
  in_RDI->lastIterationRequest = NO_ITERATIONS;
  in_RDI->timeMethod = DISTRIBUTED;
  in_RDI->mGrantCount = 0;
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::clear((BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
           *)in_stack_ffffffffffffff30);
  std::__atomic_base<unsigned_short>::operator=
            (in_stack_ffffffffffffff18,
             (__int_type_conflict5)((ulong)in_stack_ffffffffffffff10 >> 0x30));
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::clear
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x4e3159);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::clear
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x4e316a);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::clear
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)0x4e317b
            );
  (in_RDI->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (in_RDI->allowed_send_time).internalTimeCode = -0x7fffffffffffffff;
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::clear((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
           *)0x4e31a8);
  std::shared_ptr<helics::FederateOperator>::shared_ptr
            (in_stack_ffffffffffffff10,
             (nullptr_t)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::shared_ptr<helics::FederateOperator>::operator=
            (in_stack_ffffffffffffff10,
             (shared_ptr<helics::FederateOperator> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::shared_ptr<helics::FederateOperator>::~shared_ptr
            ((shared_ptr<helics::FederateOperator> *)0x4e31df);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x4e31f0);
  local_40 = local_10;
  local_48._M_current =
       (pair<int,_TimeRepresentation<count_time<9,_long>_>_> *)
       CLI::std::
       vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
       ::begin((vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  local_50 = (pair<int,_TimeRepresentation<count_time<9,_long>_>_> *)
             CLI::std::
             vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
             ::end((vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
               ::operator*(&local_48);
    local_60._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_58->second).internalTimeCode;
    setProperty(in_stack_000000f8,this._4_4_,in_stack_00000100);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
    ::operator++(&local_48);
  }
  local_68 = (element_type *)
             ((long)&(local_10->
                     super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl.field_2 + 8);
  local_70 = CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  CLI::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator*(&stack0xffffffffffffff90);
    setProperty((FederateState *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&stack0xffffffffffffff90);
  }
  local_88 = (pointer)&(local_10->
                       super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl.field_2;
  local_90 = CLI::std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
                       ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                        CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  CLI::std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator*(&stack0xffffffffffffff70);
    setOptionFlag(in_RDI,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                  SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator++(&stack0xffffffffffffff70);
  }
  this_00 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
            operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
                       0x4e33c0);
  this_01 = (LogManager *)local_c0;
  std::function<void(helics::ActionMessage&&)>::
  function<helics::FederateState::reset(helics::CoreFederateInfo_const&)::__0,void>
            ((function<void_(helics::ActionMessage_&&)> *)in_RDI,(anon_class_8_1_8991fb9c *)this_01)
  ;
  LogManager::setTransmitCallback
            (this_00,(function<void_(helics::ActionMessage_&&)> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x4e3401);
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator->
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)0x4e3412);
  iVar2 = LogManager::getMaxLevel(this_01);
  in_RDI->maxLogLevel = iVar2;
  return;
}

Assistant:

void FederateState::reset(const CoreFederateInfo& fedInfo)
{
    state = FederateStates::CREATED;
    queue.clear();
    delayQueues.clear();
    interfaceInformation.reset();

    timeCoord =
        std::make_unique<TimeCoordinator>([this](const ActionMessage& msg) { routeMessage(msg); });

    only_transmit_on_change = false;
    realtime = false;
    observer = false;
    // reentrant should stay the same
    mSourceOnly = false;
    mCallbackBased = false;
    strict_input_type_checking = false;
    ignore_unit_mismatch = false;
    mSlowResponding = false;
    // allow remote control needs to remain the same

    mLogManager = std::make_unique<LogManager>();
    maxLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
    init_transmitted = false;

    wait_for_current_time = false;
    ignore_time_mismatch_warnings = false;
    mProfilerActive = false;
    mLocalProfileCapture = false;
    errorCode = 0;
    // leave mParent alone
    // CommonCore* mParent{nullptr};  //!< pointer to the higher level;
    errorString.clear();
    rt_lag = timeZero;
    rt_lead = timeZero;
    grantTimeOutPeriod = timeZero;
    realTimeTimerIndex = -1;
    grantTimeoutTimeIndex = -1;
    initRequested = false;
    requestingMode = false;
    initIterating = false;

    iterating = false;
    timeGranted_mode = false;
    terminate_on_error = false;
    lastIterationRequest = IterationRequest::NO_ITERATIONS;
    timeMethod = TimeSynchronizationMethod::DISTRIBUTED;
    mGrantCount = 0;
    commandQueue.clear();
    interfaceFlags = 0;

    events.clear();
    eventMessages.clear();
    delayedFederates.clear();
    time_granted = startupTime;
    allowed_send_time = startupTime;

    queryCallbacks.clear();
    fedCallbacks = nullptr;
    tags.clear();
    // now update with the new properties
    for (const auto& prop : fedInfo.timeProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.intProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.flagProps) {
        setOptionFlag(prop.first, prop.second);
    }
    mLogManager->setTransmitCallback(
        [this](ActionMessage&& message) { mParent->addActionMessage(std::move(message)); });
    maxLogLevel = mLogManager->getMaxLevel();
}